

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_hash_map_test.cc
# Opt level: O3

void __thiscall
phmap::priv::anon_unknown_5::ParallelFlatHashMap_ForEach_Test::~ParallelFlatHashMap_ForEach_Test
          (ParallelFlatHashMap_ForEach_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(THIS_TEST_NAME, ForEach) {
    // -------------
    // test for_each
    // -------------
    using Map = ThisMap<int, int>;
    Map m = { {1, 7}, {2, 8}, {5, 11} };

    // increment all values by 1
    m.for_each_m([](Map::value_type &pair) {  ++pair.second; });

    int counter = 0;
    m.for_each([&counter](const Map::value_type &pair) {
            ++counter;
            EXPECT_EQ(pair.first + 7, pair.second);
        });
    EXPECT_EQ(counter, 3);
    
    counter = 0;
    for (size_t i=0; i<m.subcnt(); ++i) {
        m.with_submap(i, [&](const Map::EmbeddedSet& set) {
            for (auto& p : set) {
                ++counter;
                EXPECT_EQ(p.first + 7, p.second);
            }
        });
    }
    EXPECT_EQ(counter, 3);
}